

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SchemaAttDef.hpp
# Opt level: O0

void __thiscall
xercesc_4_0::SchemaAttDef::setNamespaceList(SchemaAttDef *this,ValueVectorOf<unsigned_int> *toSet)

{
  XMLSize_t XVar1;
  MemoryManager *manager;
  ValueVectorOf<unsigned_int> *this_00;
  ValueVectorOf<unsigned_int> *toSet_local;
  SchemaAttDef *this_local;
  
  if ((toSet == (ValueVectorOf<unsigned_int> *)0x0) ||
     (XVar1 = ValueVectorOf<unsigned_int>::size(toSet), XVar1 == 0)) {
    resetNamespaceList(this);
  }
  else if (this->fNamespaceList == (ValueVectorOf<unsigned_int> *)0x0) {
    manager = XMLAttDef::getMemoryManager(&this->super_XMLAttDef);
    this_00 = (ValueVectorOf<unsigned_int> *)XMemory::operator_new(0x28,manager);
    ValueVectorOf<unsigned_int>::ValueVectorOf(this_00,toSet);
    this->fNamespaceList = this_00;
  }
  else {
    ValueVectorOf<unsigned_int>::operator=(this->fNamespaceList,toSet);
  }
  return;
}

Assistant:

inline void SchemaAttDef::setNamespaceList(const ValueVectorOf<unsigned int>* const toSet) {

    if (toSet && toSet->size()) {

        if (fNamespaceList) {
            *fNamespaceList = *toSet;
        }
        else {
            fNamespaceList = new (getMemoryManager()) ValueVectorOf<unsigned int>(*toSet);
        }
    }
    else  {
        resetNamespaceList();
    }
}